

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::initializer_list<unsigned_int>>
          (String *__return_storage_ptr__,detail *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *lhs,char *op,
          initializer_list<unsigned_int> *rhs)

{
  ostream *poVar1;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  poVar1 = tlssPush();
  test_detail::
  print_range<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,burst::identity_fn>
            (poVar1,this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }